

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<unsigned_char,_unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::ModulusSimpleCase(uchar lhs,
                        SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        rhs,SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            *result)

{
  bool bVar1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_RDX;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_SIL;
  undefined1 in_DIL;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *unaff_retaddr;
  undefined5 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = ::operator!=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )(uchar)((ulong)in_RDX >> 0x38),(int)in_RDX);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::SignedCase(in_SIL,in_RDX);
    if (!bVar1) {
      ::SafeInt::operator_cast_to_unsigned_char(in_RDX);
      SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
      operator=(unaff_retaddr,
                (uchar *)CONCAT17(in_stack_ffffffffffffffff,
                                  CONCAT16(in_SIL.m_int,CONCAT15(in_DIL,in_stack_fffffffffffffff8)))
               );
    }
    return true;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }